

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench-feed.c
# Opt level: O0

void bench_feed_1(void)

{
  undefined1 local_48 [8];
  bm_results_t res;
  
  bm_init_results();
  bm_run_1((bm_results_t *)local_48,_bm_feed_1);
  bm_run_10((bm_results_t *)local_48,_bm_feed_1);
  bm_display_results((bm_results_t *)local_48,"/ feed dir -> memory parsing");
  return;
}

Assistant:

void bench_feed_1(void) {
    bm_results_t res = bm_init_results();

    bm_run_1(&res, _bm_feed_1);
    bm_run_10(&res, _bm_feed_1);

    bm_display_results(&res, "/ feed dir -> memory parsing");
}